

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::inf_or_nan_writer>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
           *this,align_spec *spec,inf_or_nan_writer *f)

{
  undefined4 uVar1;
  ulong uVar2;
  unsigned_long __n;
  __type _Var4;
  counting_iterator<char> __first;
  counting_iterator<char> __first_00;
  counting_iterator<char> __first_01;
  char_type fill;
  undefined8 uVar3;
  
  uVar2 = 4 - (ulong)(f->sign == '\0');
  __n = spec->width_ - uVar2;
  if (spec->width_ < uVar2 || __n == 0) {
    inf_or_nan_writer::operator()((inf_or_nan_writer *)f,(counting_iterator<char> *)this);
    return;
  }
  fill = (char_type)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar2 = __n >> 1 & 0x7fffffff;
    __first_00._12_4_ = 0;
    __first_00._0_12_ = *(undefined1 (*) [12])this;
    _Var4 = std::__fill_n_a1<fmt::v5::internal::counting_iterator<char>,unsigned_long,char>
                      (__first_00,uVar2,&fill);
    *(size_t *)this = _Var4.count_;
    this[8] = (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>)
              _Var4.blackhole_;
    inf_or_nan_writer::operator()((inf_or_nan_writer *)f,(counting_iterator<char> *)this);
    uVar3 = *(undefined8 *)this;
    __n = __n - uVar2;
    uVar1 = *(undefined4 *)(this + 8);
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      __first._12_4_ = 0;
      __first._0_12_ = *(undefined1 (*) [12])this;
      _Var4 = std::__fill_n_a1<fmt::v5::internal::counting_iterator<char>,unsigned_long,char>
                        (__first,__n,&fill);
      *(size_t *)this = _Var4.count_;
      this[8] = (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
                 )_Var4.blackhole_;
      inf_or_nan_writer::operator()((inf_or_nan_writer *)f,(counting_iterator<char> *)this);
      return;
    }
    inf_or_nan_writer::operator()((inf_or_nan_writer *)f,(counting_iterator<char> *)this);
    uVar3 = *(undefined8 *)this;
    uVar1 = *(undefined4 *)(this + 8);
  }
  __first_01._8_4_ = uVar1;
  __first_01.count_ = uVar3;
  __first_01._12_4_ = 0;
  _Var4 = std::__fill_n_a1<fmt::v5::internal::counting_iterator<char>,unsigned_long,char>
                    (__first_01,__n,&fill);
  *(size_t *)this = _Var4.count_;
  this[8] = (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>)
            _Var4.blackhole_;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }